

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O0

int __thiscall soul::Module::Structs::remove(Structs *this,char *__filename)

{
  bool bVar1;
  undefined3 extraout_var;
  Structure *s_local;
  Structs *this_local;
  
  bVar1 = removeItem<soul::ArrayWithPreallocation<soul::RefCountedPtr<soul::Structure>,32ul>,soul::Structure&>
                    (&this->structs,(Structure *)__filename);
  return CONCAT31(extraout_var,bVar1);
}

Assistant:

bool Module::Structs::remove (Structure& s)
{
    return removeItem (structs, s);
}